

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_filter.c
# Opt level: O2

int gdImageContrast(gdImagePtr src,double contrast)

{
  uint uVar1;
  uint uVar2;
  int color;
  code *pcVar3;
  uint uVar4;
  uint uVar5;
  int r;
  int y;
  int g;
  int b;
  int x;
  double dVar6;
  double dVar7;
  double dVar8;
  
  if (src != (gdImagePtr)0x0) {
    if (src->trueColor == 0) {
      pcVar3 = gdImageGetPixel;
    }
    else {
      pcVar3 = gdImageGetTrueColorPixel;
    }
    dVar8 = (100.0 - contrast) / 100.0;
    dVar8 = dVar8 * dVar8;
    for (y = 0; y < src->sy; y = y + 1) {
      for (x = 0; x < src->sx; x = x + 1) {
        uVar1 = (*pcVar3)(src,x,y);
        if (src->trueColor == 0) {
          uVar5 = src->red[(int)uVar1];
          uVar4 = src->green[(int)uVar1];
          uVar2 = src->blue[(int)uVar1];
          uVar1 = src->alpha[(int)uVar1];
        }
        else {
          uVar5 = uVar1 >> 0x10 & 0xff;
          uVar4 = uVar1 >> 8 & 0xff;
          uVar2 = uVar1 & 0xff;
          uVar1 = uVar1 >> 0x18 & 0x7f;
        }
        dVar6 = (((double)(int)uVar5 / 255.0 + -0.5) * dVar8 + 0.5) * 255.0;
        g = 0xff;
        r = 0xff;
        if (dVar6 <= 255.0) {
          dVar7 = 0.0;
          if (0.0 <= dVar6) {
            dVar7 = dVar6;
          }
          r = (int)dVar7;
        }
        dVar6 = (((double)(int)uVar4 / 255.0 + -0.5) * dVar8 + 0.5) * 255.0;
        if (dVar6 <= 255.0) {
          dVar7 = 0.0;
          if (0.0 <= dVar6) {
            dVar7 = dVar6;
          }
          g = (int)dVar7;
        }
        dVar6 = (((double)(int)uVar2 / 255.0 + -0.5) * dVar8 + 0.5) * 255.0;
        b = 0xff;
        if (dVar6 <= 255.0) {
          dVar7 = 0.0;
          if (0.0 <= dVar6) {
            dVar7 = dVar6;
          }
          b = (int)dVar7;
        }
        color = gdImageColorAllocateAlpha(src,r,g,b,uVar1);
        if (color == -1) {
          color = gdImageColorClosestAlpha(src,r,g,b,uVar1);
        }
        gdImageSetPixel(src,x,y,color);
      }
    }
    return 1;
  }
  return 0;
}

Assistant:

BGD_DECLARE(int) gdImageContrast(gdImagePtr src, double contrast)
{
	int x, y;
	int r,g,b,a;
	double rf,gf,bf;
	int new_pxl, pxl;

	FuncPtr f;

	if (src==NULL) {
		return 0;
	}

	f = GET_PIXEL_FUNCTION(src);

	contrast = (double)(100.0-contrast)/100.0;
	contrast = contrast*contrast;

	for (y=0; y<src->sy; ++y) {
		for (x=0; x<src->sx; ++x) {
			pxl = f(src, x, y);

			r = gdImageRed(src, pxl);
			g = gdImageGreen(src, pxl);
			b = gdImageBlue(src, pxl);
			a = gdImageAlpha(src, pxl);

			rf = (double)r/255.0;
			rf = rf-0.5;
			rf = rf*contrast;
			rf = rf+0.5;
			rf = rf*255.0;

			bf = (double)b/255.0;
			bf = bf-0.5;
			bf = bf*contrast;
			bf = bf+0.5;
			bf = bf*255.0;

			gf = (double)g/255.0;
			gf = gf-0.5;
			gf = gf*contrast;
			gf = gf+0.5;
			gf = gf*255.0;

			rf = (rf > 255.0)? 255.0 : ((rf < 0.0)? 0.0:rf);
			gf = (gf > 255.0)? 255.0 : ((gf < 0.0)? 0.0:gf);
			bf = (bf > 255.0)? 255.0 : ((bf < 0.0)? 0.0:bf);

			new_pxl = gdImageColorAllocateAlpha(src, (int)rf, (int)gf, (int)bf, a);
			if (new_pxl == -1) {
				new_pxl = gdImageColorClosestAlpha(src, (int)rf, (int)gf, (int)bf, a);
			}
			gdImageSetPixel (src, x, y, new_pxl);
		}
	}
	return 1;
}